

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_joy.cpp
# Opt level: O1

void Joy_GenerateButtonEvents(int oldbuttons,int newbuttons,int numbuttons,int *keys)

{
  uint uVar1;
  ulong uVar2;
  event_t ev;
  event_t local_48;
  
  if (oldbuttons != newbuttons) {
    local_48.type = '\0';
    local_48.subtype = '\0';
    local_48.data1 = 0;
    local_48.data2 = 0;
    local_48.data3 = 0;
    local_48.x = 0;
    local_48.y = 0;
    if (0 < numbuttons) {
      uVar1 = 1;
      uVar2 = 0;
      do {
        if ((uVar1 & (oldbuttons ^ newbuttons)) != 0) {
          local_48.data1 = (SWORD)keys[uVar2];
          local_48.type = ((uVar1 & newbuttons) == 0) + '\x01';
          D_PostEvent(&local_48);
        }
        uVar1 = uVar1 * 2;
        uVar2 = uVar2 + 1;
      } while ((uint)numbuttons != uVar2);
    }
  }
  return;
}

Assistant:

void Joy_GenerateButtonEvents(int oldbuttons, int newbuttons, int numbuttons, const int *keys)
{
	int changed = oldbuttons ^ newbuttons;
	if (changed != 0)
	{
		event_t ev = { 0, 0, 0, 0, 0, 0, 0 };
		int mask = 1;
		for (int j = 0; j < numbuttons; mask <<= 1, ++j)
		{
			if (changed & mask)
			{
				ev.data1 = keys[j];
				ev.type = (newbuttons & mask) ? EV_KeyDown : EV_KeyUp;
				D_PostEvent(&ev);
			}
		}
	}
}